

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int walTryBeginRead(Wal *pWal,int *pChanged,int useWal,int cnt)

{
  uint uVar1;
  u32 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  u32 uVar7;
  u32 uVar8;
  u8 uVar9;
  uint uVar10;
  int iVar11;
  uint uVar12;
  long lVar13;
  sqlite3_io_methods *psVar14;
  u8 *aFrame;
  u64 n;
  int iVar15;
  sqlite3_file *psVar16;
  ulong uVar17;
  u32 *puVar18;
  uint uVar19;
  long in_FS_OFFSET;
  undefined4 uVar20;
  undefined4 uVar21;
  i64 szWal;
  u32 pgno;
  void *pDummy;
  u8 aBuf [32];
  long local_88;
  u32 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  u32 local_64;
  void *local_60;
  undefined1 local_58 [16];
  long local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (5 < cnt) {
    uVar10 = 0xf;
    if (100 < (uint)cnt) goto LAB_0012c94f;
    iVar15 = 1;
    if (9 < (uint)cnt) {
      iVar15 = (cnt + -9) * (cnt + -9) * 0x27;
    }
    (*pWal->pVfs->xSleep)(pWal->pVfs,iVar15);
  }
  if (useWal != 0) {
    puVar18 = *pWal->apWiData + 0x18;
    uVar10 = 0;
    goto LAB_0012c3f4;
  }
  if (pWal->bShmUnreliable == '\0') {
    uVar10 = walIndexReadHdr(pWal,pChanged);
    if (uVar10 == 0) {
      if (pWal->bShmUnreliable != '\0') goto LAB_0012c4c1;
      puVar18 = *pWal->apWiData + 0x18;
      uVar10 = 0;
      if ((*pWal->apWiData)[0x18] == (pWal->hdr).mxFrame) {
        uVar9 = pWal->exclusiveMode;
        uVar10 = 0;
        if (uVar9 == '\0') {
          uVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6);
          uVar9 = pWal->exclusiveMode;
        }
        if (uVar9 != '\x02') {
          (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
        }
        if (uVar10 != 5) {
          if (uVar10 != 0) goto LAB_0012c94f;
          iVar15 = bcmp(*pWal->apWiData,&pWal->hdr,0x30);
          if (iVar15 != 0) {
            uVar10 = 0xffffffff;
            if (pWal->exclusiveMode != '\0') goto LAB_0012c94f;
            psVar16 = pWal->pDbFd;
            psVar14 = psVar16->pMethods;
            iVar15 = 3;
            goto LAB_0012c686;
          }
          pWal->readLock = 0;
          goto LAB_0012c94d;
        }
      }
LAB_0012c3f4:
      uVar12 = (pWal->hdr).mxFrame;
      uVar19 = 0;
      lVar13 = 2;
      uVar17 = 0;
      do {
        uVar1 = puVar18[lVar13];
        if (uVar1 <= uVar12 && uVar19 <= uVar1) {
          uVar17 = (ulong)((int)lVar13 - 1);
          uVar19 = uVar1;
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
      if ((pWal->readOnly & 2) == 0) {
        if ((uVar19 < uVar12) || ((int)uVar17 == 0)) {
          lVar13 = 0;
          local_78 = uVar17;
          do {
            iVar15 = (int)lVar13 + 4;
            if (pWal->exclusiveMode != '\0') {
LAB_0012c5f0:
              puVar18[lVar13 + 2] = uVar12;
              if (pWal->exclusiveMode == '\0') {
                (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar15,1,9);
              }
              uVar17 = (ulong)((int)lVar13 + 1);
              uVar19 = uVar12;
              goto LAB_0012c620;
            }
            uVar10 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar15,1,10);
            if (uVar10 != 5) {
              if (uVar10 == 0) goto LAB_0012c5f0;
              goto LAB_0012c94f;
            }
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 != 4);
          uVar10 = 5;
          uVar17 = local_78;
          goto LAB_0012c497;
        }
      }
      else {
LAB_0012c497:
        if ((int)uVar17 == 0) {
          uVar10 = -(uint)(uVar10 == 5) | 0x508;
          goto LAB_0012c94f;
        }
      }
LAB_0012c620:
      iVar15 = (int)uVar17 + 3;
      uVar9 = pWal->exclusiveMode;
      if (uVar9 == '\0') {
        uVar12 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,iVar15,1,6);
        if (uVar12 != 0) {
          uVar10 = 0xffffffff;
LAB_0012c6c0:
          if (uVar12 != 5) {
            uVar10 = uVar12;
          }
          goto LAB_0012c94f;
        }
        uVar9 = pWal->exclusiveMode;
      }
      pWal->minFrame = *puVar18 + 1;
      if (uVar9 != '\x02') {
        (*pWal->pDbFd->pMethods->xShmBarrier)(pWal->pDbFd);
      }
      if ((puVar18[(long)(int)uVar17 + 1] == uVar19) &&
         (iVar11 = bcmp(*pWal->apWiData,&pWal->hdr,0x30), iVar11 == 0)) {
        pWal->readLock = (i16)uVar17;
LAB_0012c94d:
        uVar10 = 0;
        goto LAB_0012c94f;
      }
      uVar10 = 0xffffffff;
      if (pWal->exclusiveMode != '\0') goto LAB_0012c94f;
      psVar16 = pWal->pDbFd;
      psVar14 = psVar16->pMethods;
    }
    else {
      if (((uVar10 != 5) || (uVar10 = 0xffffffff, *pWal->apWiData == (u32 *)0x0)) ||
         (pWal->exclusiveMode != '\0')) goto LAB_0012c94f;
      uVar12 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,2,1,6);
      if (uVar12 != 0) {
        uVar10 = 0x105;
        goto LAB_0012c6c0;
      }
      uVar10 = 0xffffffff;
      if (pWal->exclusiveMode != '\0') goto LAB_0012c94f;
      psVar16 = pWal->pDbFd;
      psVar14 = psVar16->pMethods;
      iVar15 = 2;
    }
LAB_0012c686:
    (*psVar14->xShmLock)(psVar16,iVar15,1,5);
    uVar10 = 0xffffffff;
  }
  else {
LAB_0012c4c1:
    if ((pWal->exclusiveMode == '\0') &&
       (uVar12 = (*pWal->pDbFd->pMethods->xShmLock)(pWal->pDbFd,3,1,6), uVar12 != 0)) {
      uVar10 = 0xffffffff;
      if (uVar12 != 5) {
        uVar10 = uVar12;
      }
    }
    else {
      pWal->readLock = 0;
      aFrame = (u8 *)0x0;
      uVar12 = (*pWal->pDbFd->pMethods->xShmMap)(pWal->pDbFd,0,0x8000,0,&local_60);
      uVar10 = 0xffffffff;
      if (uVar12 != 8) {
        if (uVar12 != 0x508) {
LAB_0012c8fb:
          sqlite3_free(aFrame);
          uVar10 = uVar12;
          if (uVar12 != 0) goto LAB_0012c907;
          goto LAB_0012c94d;
        }
        psVar16 = pWal->pWalFd;
        puVar18 = *pWal->apWiData;
        uVar2 = puVar18[1];
        uVar3 = *(undefined8 *)(puVar18 + 2);
        uVar7 = puVar18[4];
        uVar8 = puVar18[5];
        uVar4 = *(undefined8 *)(puVar18 + 6);
        uVar5 = *(undefined8 *)(puVar18 + 8);
        uVar6 = *(undefined8 *)(puVar18 + 10);
        (pWal->hdr).iVersion = puVar18[0];
        (pWal->hdr).unused = uVar2;
        (pWal->hdr).iChange = (int)uVar3;
        (pWal->hdr).isInit = (char)((ulong)uVar3 >> 0x20);
        (pWal->hdr).bigEndCksum = (char)((ulong)uVar3 >> 0x28);
        (pWal->hdr).szPage = (short)((ulong)uVar3 >> 0x30);
        (pWal->hdr).mxFrame = uVar7;
        (pWal->hdr).nPage = uVar8;
        *(undefined8 *)(pWal->hdr).aFrameCksum = uVar4;
        *(undefined8 *)(pWal->hdr).aSalt = uVar5;
        *(undefined8 *)(pWal->hdr).aCksum = uVar6;
        uVar10 = (*psVar16->pMethods->xFileSize)(psVar16,&local_88);
        if (uVar10 == 0) {
          if (local_88 < 0x20) {
            *pChanged = 1;
            aFrame = (u8 *)0x0;
            uVar12 = -(uint)((pWal->hdr).mxFrame != 0);
            goto LAB_0012c8fb;
          }
          uVar10 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,local_58,0x20,0);
          if ((uVar10 == 0) && (uVar10 = 0xffffffff, *(long *)(pWal->hdr).aSalt == local_48)) {
            uVar2 = pWal->szPage;
            iVar15 = sqlite3_initialize();
            uVar10 = 7;
            if (iVar15 == 0) {
              iVar15 = uVar2 + 0x18;
              n = (u64)iVar15;
              aFrame = (u8 *)sqlite3Malloc(n);
              uVar10 = 7;
              if (aFrame != (u8 *)0x0) {
                uVar17 = *(ulong *)(pWal->hdr).aFrameCksum;
                lVar13 = (ulong)(pWal->szPage + 0x18) * (ulong)(pWal->hdr).mxFrame;
                if (local_88 < (long)(n + lVar13 + 0x20)) {
                  uVar12 = 0;
                  uVar20 = (int)uVar17;
                  uVar21 = (int)(uVar17 >> 0x20);
                }
                else {
                  uStack_70 = 0;
                  lVar13 = lVar13 + 0x20;
                  local_78 = uVar17;
                  do {
                    uVar12 = (*pWal->pWalFd->pMethods->xRead)(pWal->pWalFd,aFrame,iVar15,lVar13);
                    if (uVar12 != 0) goto LAB_0012c8ea;
                    iVar11 = walDecodeFrame(pWal,&local_64,&local_7c,aFrame + 0x18,aFrame);
                    if (iVar11 == 0) break;
                    if (local_7c != 0) {
                      uVar12 = 0xffffffff;
                      goto LAB_0012c8ea;
                    }
                    lVar13 = lVar13 + n;
                  } while ((long)(n + lVar13) <= local_88);
                  uVar12 = 0;
LAB_0012c8ea:
                  uVar20 = (undefined4)local_78;
                  uVar21 = local_78._4_4_;
                }
                *(ulong *)(pWal->hdr).aFrameCksum = CONCAT44(uVar21,uVar20);
                goto LAB_0012c8fb;
              }
            }
          }
        }
      }
    }
LAB_0012c907:
    if (0 < pWal->nWiData) {
      lVar13 = 0;
      do {
        sqlite3_free(pWal->apWiData[lVar13]);
        pWal->apWiData[lVar13] = (u32 *)0x0;
        lVar13 = lVar13 + 1;
      } while (lVar13 < pWal->nWiData);
    }
    pWal->bShmUnreliable = '\0';
    sqlite3WalEndReadTransaction(pWal);
    *pChanged = 1;
  }
LAB_0012c94f:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return uVar10;
}

Assistant:

static int walTryBeginRead(Wal *pWal, int *pChanged, int useWal, int cnt){
  volatile WalCkptInfo *pInfo;    /* Checkpoint information in wal-index */
  u32 mxReadMark;                 /* Largest aReadMark[] value */
  int mxI;                        /* Index of largest aReadMark[] value */
  int i;                          /* Loop counter */
  int rc = SQLITE_OK;             /* Return code  */
  u32 mxFrame;                    /* Wal frame to lock to */

  assert( pWal->readLock<0 );     /* Not currently locked */

  /* useWal may only be set for read/write connections */
  assert( (pWal->readOnly & WAL_SHM_RDONLY)==0 || useWal==0 );

  /* Take steps to avoid spinning forever if there is a protocol error.
  **
  ** Circumstances that cause a RETRY should only last for the briefest
  ** instances of time.  No I/O or other system calls are done while the
  ** locks are held, so the locks should not be held for very long. But
  ** if we are unlucky, another process that is holding a lock might get
  ** paged out or take a page-fault that is time-consuming to resolve,
  ** during the few nanoseconds that it is holding the lock.  In that case,
  ** it might take longer than normal for the lock to free.
  **
  ** After 5 RETRYs, we begin calling sqlite3OsSleep().  The first few
  ** calls to sqlite3OsSleep() have a delay of 1 microsecond.  Really this
  ** is more of a scheduler yield than an actual delay.  But on the 10th
  ** an subsequent retries, the delays start becoming longer and longer,
  ** so that on the 100th (and last) RETRY we delay for 323 milliseconds.
  ** The total delay time before giving up is less than 10 seconds.
  */
  if( cnt>5 ){
    int nDelay = 1;                      /* Pause time in microseconds */
    if( cnt>100 ){
      VVA_ONLY( pWal->lockError = 1; )
      return SQLITE_PROTOCOL;
    }
    if( cnt>=10 ) nDelay = (cnt-9)*(cnt-9)*39;
    sqlite3OsSleep(pWal->pVfs, nDelay);
  }

  if( !useWal ){
    assert( rc==SQLITE_OK );
    if( pWal->bShmUnreliable==0 ){
      rc = walIndexReadHdr(pWal, pChanged);
    }
    if( rc==SQLITE_BUSY ){
      /* If there is not a recovery running in another thread or process
      ** then convert BUSY errors to WAL_RETRY.  If recovery is known to
      ** be running, convert BUSY to BUSY_RECOVERY.  There is a race here
      ** which might cause WAL_RETRY to be returned even if BUSY_RECOVERY
      ** would be technically correct.  But the race is benign since with
      ** WAL_RETRY this routine will be called again and will probably be
      ** right on the second iteration.
      */
      if( pWal->apWiData[0]==0 ){
        /* This branch is taken when the xShmMap() method returns SQLITE_BUSY.
        ** We assume this is a transient condition, so return WAL_RETRY. The
        ** xShmMap() implementation used by the default unix and win32 VFS
        ** modules may return SQLITE_BUSY due to a race condition in the
        ** code that determines whether or not the shared-memory region
        ** must be zeroed before the requested page is returned.
        */
        rc = WAL_RETRY;
      }else if( SQLITE_OK==(rc = walLockShared(pWal, WAL_RECOVER_LOCK)) ){
        walUnlockShared(pWal, WAL_RECOVER_LOCK);
        rc = WAL_RETRY;
      }else if( rc==SQLITE_BUSY ){
        rc = SQLITE_BUSY_RECOVERY;
      }
    }
    if( rc!=SQLITE_OK ){
      return rc;
    }
    else if( pWal->bShmUnreliable ){
      return walBeginShmUnreliable(pWal, pChanged);
    }
  }

  assert( pWal->nWiData>0 );
  assert( pWal->apWiData[0]!=0 );
  pInfo = walCkptInfo(pWal);
  if( !useWal && AtomicLoad(&pInfo->nBackfill)==pWal->hdr.mxFrame
#ifdef SQLITE_ENABLE_SNAPSHOT
   && (pWal->pSnapshot==0 || pWal->hdr.mxFrame==0)
#endif
  ){
    /* The WAL has been completely backfilled (or it is empty).
    ** and can be safely ignored.
    */
    rc = walLockShared(pWal, WAL_READ_LOCK(0));
    walShmBarrier(pWal);
    if( rc==SQLITE_OK ){
      if( memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr)) ){
        /* It is not safe to allow the reader to continue here if frames
        ** may have been appended to the log before READ_LOCK(0) was obtained.
        ** When holding READ_LOCK(0), the reader ignores the entire log file,
        ** which implies that the database file contains a trustworthy
        ** snapshot. Since holding READ_LOCK(0) prevents a checkpoint from
        ** happening, this is usually correct.
        **
        ** However, if frames have been appended to the log (or if the log
        ** is wrapped and written for that matter) before the READ_LOCK(0)
        ** is obtained, that is not necessarily true. A checkpointer may
        ** have started to backfill the appended frames but crashed before
        ** it finished. Leaving a corrupt image in the database file.
        */
        walUnlockShared(pWal, WAL_READ_LOCK(0));
        return WAL_RETRY;
      }
      pWal->readLock = 0;
      return SQLITE_OK;
    }else if( rc!=SQLITE_BUSY ){
      return rc;
    }
  }

  /* If we get this far, it means that the reader will want to use
  ** the WAL to get at content from recent commits.  The job now is
  ** to select one of the aReadMark[] entries that is closest to
  ** but not exceeding pWal->hdr.mxFrame and lock that entry.
  */
  mxReadMark = 0;
  mxI = 0;
  mxFrame = pWal->hdr.mxFrame;
#ifdef SQLITE_ENABLE_SNAPSHOT
  if( pWal->pSnapshot && pWal->pSnapshot->mxFrame<mxFrame ){
    mxFrame = pWal->pSnapshot->mxFrame;
  }
#endif
  for(i=1; i<WAL_NREADER; i++){
    u32 thisMark = AtomicLoad(pInfo->aReadMark+i);
    if( mxReadMark<=thisMark && thisMark<=mxFrame ){
      assert( thisMark!=READMARK_NOT_USED );
      mxReadMark = thisMark;
      mxI = i;
    }
  }
  if( (pWal->readOnly & WAL_SHM_RDONLY)==0
   && (mxReadMark<mxFrame || mxI==0)
  ){
    for(i=1; i<WAL_NREADER; i++){
      rc = walLockExclusive(pWal, WAL_READ_LOCK(i), 1);
      if( rc==SQLITE_OK ){
        AtomicStore(pInfo->aReadMark+i,mxFrame);
        mxReadMark = mxFrame;
        mxI = i;
        walUnlockExclusive(pWal, WAL_READ_LOCK(i), 1);
        break;
      }else if( rc!=SQLITE_BUSY ){
        return rc;
      }
    }
  }
  if( mxI==0 ){
    assert( rc==SQLITE_BUSY || (pWal->readOnly & WAL_SHM_RDONLY)!=0 );
    return rc==SQLITE_BUSY ? WAL_RETRY : SQLITE_READONLY_CANTINIT;
  }

  rc = walLockShared(pWal, WAL_READ_LOCK(mxI));
  if( rc ){
    return rc==SQLITE_BUSY ? WAL_RETRY : rc;
  }
  /* Now that the read-lock has been obtained, check that neither the
  ** value in the aReadMark[] array or the contents of the wal-index
  ** header have changed.
  **
  ** It is necessary to check that the wal-index header did not change
  ** between the time it was read and when the shared-lock was obtained
  ** on WAL_READ_LOCK(mxI) was obtained to account for the possibility
  ** that the log file may have been wrapped by a writer, or that frames
  ** that occur later in the log than pWal->hdr.mxFrame may have been
  ** copied into the database by a checkpointer. If either of these things
  ** happened, then reading the database with the current value of
  ** pWal->hdr.mxFrame risks reading a corrupted snapshot. So, retry
  ** instead.
  **
  ** Before checking that the live wal-index header has not changed
  ** since it was read, set Wal.minFrame to the first frame in the wal
  ** file that has not yet been checkpointed. This client will not need
  ** to read any frames earlier than minFrame from the wal file - they
  ** can be safely read directly from the database file.
  **
  ** Because a ShmBarrier() call is made between taking the copy of
  ** nBackfill and checking that the wal-header in shared-memory still
  ** matches the one cached in pWal->hdr, it is guaranteed that the
  ** checkpointer that set nBackfill was not working with a wal-index
  ** header newer than that cached in pWal->hdr. If it were, that could
  ** cause a problem. The checkpointer could omit to checkpoint
  ** a version of page X that lies before pWal->minFrame (call that version
  ** A) on the basis that there is a newer version (version B) of the same
  ** page later in the wal file. But if version B happens to like past
  ** frame pWal->hdr.mxFrame - then the client would incorrectly assume
  ** that it can read version A from the database file. However, since
  ** we can guarantee that the checkpointer that set nBackfill could not
  ** see any pages past pWal->hdr.mxFrame, this problem does not come up.
  */
  pWal->minFrame = AtomicLoad(&pInfo->nBackfill)+1;
  walShmBarrier(pWal);
  if( AtomicLoad(pInfo->aReadMark+mxI)!=mxReadMark
   || memcmp((void *)walIndexHdr(pWal), &pWal->hdr, sizeof(WalIndexHdr))
  ){
    walUnlockShared(pWal, WAL_READ_LOCK(mxI));
    return WAL_RETRY;
  }else{
    assert( mxReadMark<=pWal->hdr.mxFrame );
    pWal->readLock = (i16)mxI;
  }
  return rc;
}